

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  param_type *this_00;
  undefined8 *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  double beta;
  double alpha;
  delim_c *in_stack_ffffffffffffff98;
  basic_istream<char,_std::char_traits<char>_> *alpha_00;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  double local_20;
  double local_18;
  undefined8 *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  alpha_00 = local_8;
  utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff98);
  this_00 = (param_type *)std::istream::operator>>((istream *)pbVar3,&local_18);
  utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff98);
  std::istream::operator>>((istream *)pbVar3,&local_20);
  utility::delim('\0');
  utility::operator>>(this,in_stack_ffffffffffffff98);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    beta_dist<double>::param_type::param_type
              (this_00,(result_type_conflict2)alpha_00,(result_type_conflict2)this);
    *local_10 = local_40;
    local_10[1] = local_38;
    local_10[2] = local_30;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t alpha, beta;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> alpha >> utility::delim(' ') >> beta >>
            utility::delim(')');
        if (in)
          P = param_type(alpha, beta);
        in.flags(flags);
        return in;
      }